

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * Kvm::stringToSymbol(Kvm *vm,Value *args)

{
  _func_int **__s;
  Value *pVVar1;
  allocator<char> local_41;
  string local_40;
  Value *local_20;
  String *s;
  Value *args_local;
  Kvm *vm_local;
  
  s = (String *)args;
  args_local = (Value *)vm;
  local_20 = car(args);
  pVVar1 = args_local;
  __s = local_20[1]._vptr_Value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)__s,&local_41);
  pVVar1 = makeSymbol((Kvm *)pVVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return pVVar1;
}

Assistant:

const Value* Kvm::stringToSymbol(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    return vm->makeSymbol(s->value_);
}